

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O1

bool pd::readPhrases(string *dir_name,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *phrases)

{
  uint uVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  error_code *peVar5;
  ostream *poVar6;
  bool bVar7;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_2f0;
  ifstream fi;
  dir_itr_imp local_2e0 [16];
  uint auStack_2d0 [122];
  size_type *local_e8;
  path targetDir;
  long local_c0;
  undefined1 local_b8 [16];
  size_type *local_a8;
  string cur_filename;
  size_type *local_80;
  string line;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_48;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_40;
  directory_iterator local_38;
  
  local_e8 = &targetDir.m_pathname._M_string_length;
  pcVar2 = (dir_name->_M_dataplus)._M_p;
  cur_filename.field_2._8_8_ = phrases;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar2,pcVar2 + dir_name->_M_string_length);
  boost::filesystem::directory_iterator::directory_iterator
            ((directory_iterator *)((long)&line.field_2 + 8),(path *)&local_e8,none);
  it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_2f0.px = (dir_itr_imp *)line.field_2._8_8_;
  if (line.field_2._8_8_ != 0) {
    LOCK();
    *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
    UNLOCK();
  }
  _fi = 0;
  eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                 (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)line.field_2._8_8_;
  if (line.field_2._8_8_ != 0) {
    LOCK();
    *(int *)line.field_2._8_8_ = *(int *)line.field_2._8_8_ + 1;
    UNLOCK();
  }
  local_48.px = (dir_itr_imp *)0x0;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f0);
  local_2f0 = eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  local_38 = (directory_iterator)(directory_iterator)eod.m_imp.px;
  if (eod.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f0);
  local_2f0.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  local_40.px = local_48.px;
  if (local_48.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_48.px = *(int *)local_48.px + 1;
    UNLOCK();
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_2f0);
  if (local_38.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px) {
    do {
      if (((local_38.m_imp.px == (dir_itr_imp *)0x0) ||
          (*(long *)((long)local_38.m_imp.px + 0x38) == 0)) &&
         ((local_40.px == (dir_itr_imp *)0x0 || (*(long *)(local_40.px + 0x38) == 0)))) break;
      peVar5 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_38);
      boost::filesystem::detail::status((path *)&local_2f0,peVar5);
      if ((int)local_2f0.px == 2) {
        boost::filesystem::path::extension();
        iVar4 = boost::filesystem::path::compare((path *)&local_2f0,"swp");
        if (local_2f0.px != local_2e0) {
          operator_delete(local_2f0.px);
        }
        if (iVar4 != 0) {
          std::ifstream::ifstream((istream *)&local_2f0,(string *)peVar5,_S_in);
          uVar1 = *(uint *)((long)auStack_2d0 + *(long *)(local_2f0.px + -0x18));
          if ((uVar1 & 5) == 0) {
            local_80 = &line._M_string_length;
            line._M_dataplus._M_p = (pointer)0x0;
            line._M_string_length._0_1_ = 0;
            cVar3 = std::ios::widen((char)*(undefined8 *)(local_2f0.px + -0x18) +
                                    (char)(istream *)&local_2f0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_2f0,(string *)&local_80,cVar3);
            boost::filesystem::path::filename();
            local_a8 = &cur_filename._M_string_length;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,targetDir.m_pathname.field_2._8_8_,
                       local_c0 + targetDir.m_pathname.field_2._8_8_);
            if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_b8) {
              operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
            }
            std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x6,0x13b255);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)cur_filename.field_2._8_8_,&local_a8,&local_80);
            if (local_a8 != &cur_filename._M_string_length) {
              operator_delete(local_a8);
            }
            if (local_80 != &line._M_string_length) {
              operator_delete(local_80);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)peVar5,(long)peVar5->cat_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"doesn\'t exist",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          std::ifstream::~ifstream((istream *)&local_2f0);
          if ((uVar1 & 5) != 0) {
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_38.m_imp);
            bVar7 = false;
            goto LAB_00122075;
          }
        }
      }
      boost::filesystem::detail::directory_iterator_increment(&local_38,(error_code *)0x0);
    } while (local_38.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_40.px
            );
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_38.m_imp);
  bVar7 = true;
LAB_00122075:
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_48);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)((long)&line.field_2 + 8));
  if (local_e8 != &targetDir.m_pathname._M_string_length) {
    operator_delete(local_e8);
  }
  return bVar7;
}

Assistant:

bool readPhrases(const std::string& dir_name, std::unordered_map<std::string, std::string>& phrases)
    {        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::getline(fi, line);
                std::string cur_filename = p.filename().string();
                cur_filename.replace(0, 6, "words");
                phrases.emplace(cur_filename, line);
            } 
        }
        return true;
    }